

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O0

void BrotliCompressFragmentFastImpl9
               (BrotliOnePassArena *s,uint8_t *input,size_t input_size,int is_last,int *table,
               size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  byte bVar20;
  int in_ECX;
  uint16_t *puVar21;
  BrotliOnePassArena *in_RDX;
  uint8_t *in_RSI;
  size_t in_RDI;
  BrotliOnePassArena *in_R8;
  size_t *in_R9;
  bool bVar22;
  uint8_t *in_stack_00000008;
  size_t insert_1;
  uint32_t cur_hash_1;
  uint32_t prev_hash_1;
  uint64_t input_bytes_1;
  size_t matched_1;
  uint8_t *base_1;
  uint32_t cur_hash;
  uint32_t prev_hash;
  uint64_t input_bytes;
  size_t insert;
  int distance;
  size_t matched;
  uint8_t *base;
  uint32_t bytes_between_hash_lookups;
  uint32_t hash;
  uint8_t *candidate;
  uint8_t *next_ip;
  uint32_t skip;
  uint32_t next_hash;
  uint8_t *ip_limit;
  size_t len_limit;
  size_t i;
  size_t shift;
  int last_distance;
  uint8_t *ip;
  size_t literal_ratio;
  size_t mlen_storage_ix;
  size_t total_block_size;
  size_t block_size;
  uint8_t *metablock_start;
  size_t kMinMatchLen;
  size_t kInputMarginBytes;
  uint8_t *base_ip;
  uint8_t *next_emit;
  uint8_t *ip_end;
  uint16_t *lit_bits;
  uint8_t *lit_depth;
  uint32_t *cmd_histo;
  uint16_t *cmd_bits;
  uint8_t *cmd_depth;
  uint64_t v_52;
  uint8_t *p_52;
  uint64_t v_15;
  uint8_t *p_15;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  uint64_t h_10;
  uint64_t h_1;
  uint64_t h;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  size_t code_1;
  uint32_t nbits_1;
  size_t tail_1;
  size_t inscode;
  size_t prefix;
  uint32_t nbits;
  size_t tail;
  size_t code;
  uint64_t v_9;
  uint8_t *p_9;
  uint64_t v_8;
  uint8_t *p_8;
  uint64_t v_7;
  uint8_t *p_7;
  uint64_t v_6;
  uint8_t *p_6;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  size_t code_8;
  uint32_t nbits_9;
  size_t tail_8;
  size_t inscode_1;
  size_t prefix_5;
  uint32_t nbits_8;
  size_t tail_7;
  size_t code_7;
  uint64_t v_45;
  uint8_t *p_45;
  uint64_t v_44;
  uint8_t *p_44;
  uint64_t v_43;
  uint8_t *p_43;
  uint64_t v_42;
  uint8_t *p_42;
  uint64_t v_41;
  uint8_t *p_41;
  uint64_t v_40;
  uint8_t *p_40;
  uint64_t v_39;
  uint8_t *p_39;
  size_t compressed;
  size_t compressed_1;
  uint64_t v_13;
  uint8_t *p_13;
  uint64_t v_12;
  uint8_t *p_12;
  uint64_t v_11;
  uint8_t *p_11;
  uint64_t v_10;
  uint8_t *p_10;
  uint64_t v_50;
  uint8_t *p_50;
  uint64_t v_49;
  uint8_t *p_49;
  uint64_t v_48;
  uint8_t *p_48;
  uint64_t v_47;
  uint8_t *p_47;
  uint8_t lit;
  size_t j;
  uint64_t v_14;
  uint8_t *p_14;
  uint8_t lit_1;
  size_t j_1;
  uint64_t v_46;
  uint8_t *p_46;
  uint8_t lit_2;
  size_t j_2;
  uint64_t v_51;
  uint8_t *p_51;
  size_t distcode_1;
  size_t offset_1;
  size_t prefix_4;
  uint32_t nbits_7;
  size_t d_1;
  uint64_t v_38;
  uint8_t *p_38;
  uint64_t v_37;
  uint8_t *p_37;
  size_t distcode;
  size_t offset;
  size_t prefix_1;
  uint32_t nbits_2;
  size_t d;
  uint64_t v_17;
  uint8_t *p_17;
  uint64_t v_16;
  uint8_t *p_16;
  size_t code_4;
  uint32_t nbits_4;
  size_t tail_4;
  size_t code_3;
  size_t tail_3;
  size_t code_2;
  size_t prefix_2;
  uint32_t nbits_3;
  size_t tail_2;
  uint64_t v_29;
  uint8_t *p_29;
  uint64_t v_28;
  uint8_t *p_28;
  uint64_t v_27;
  uint8_t *p_27;
  uint64_t v_26;
  uint8_t *p_26;
  uint64_t v_25;
  uint8_t *p_25;
  uint64_t v_24;
  uint8_t *p_24;
  uint64_t v_23;
  uint8_t *p_23;
  uint64_t v_22;
  uint8_t *p_22;
  uint64_t v_21;
  uint8_t *p_21;
  uint64_t v_20;
  uint8_t *p_20;
  uint64_t v_19;
  uint8_t *p_19;
  uint64_t v_18;
  uint8_t *p_18;
  uint64_t t_7;
  uint64_t t_6;
  uint64_t t_12;
  uint64_t t_11;
  uint64_t t;
  uint64_t t_1;
  uint64_t t_14;
  uint64_t t_13;
  uint64_t t_8;
  uint64_t h_9;
  uint64_t h_8;
  uint64_t h_7;
  uint64_t h_6;
  uint64_t h_5;
  uint64_t h_4;
  uint64_t h_3;
  uint64_t h_2;
  size_t code_6;
  uint32_t nbits_6;
  size_t tail_6;
  size_t code_5;
  size_t prefix_3;
  uint32_t nbits_5;
  size_t tail_5;
  uint64_t v_36;
  uint8_t *p_36;
  uint64_t v_35;
  uint8_t *p_35;
  uint64_t v_34;
  uint8_t *p_34;
  uint64_t v_33;
  uint8_t *p_33;
  uint64_t v_32;
  uint8_t *p_32;
  uint64_t v_31;
  uint8_t *p_31;
  uint64_t v_30;
  uint8_t *p_30;
  uint32_t t_3;
  uint32_t t_2;
  uint32_t t_5;
  uint32_t t_4;
  uint32_t t_10;
  uint32_t t_9;
  BrotliOnePassArena *in_stack_ffffffffffffe9b0;
  BrotliOnePassArena *in_stack_ffffffffffffe9b8;
  uint in_stack_ffffffffffffe9c0;
  undefined1 in_stack_ffffffffffffe9c4;
  undefined1 in_stack_ffffffffffffe9c5;
  undefined1 in_stack_ffffffffffffe9c6;
  undefined1 in_stack_ffffffffffffe9c7;
  uint16_t *in_stack_ffffffffffffe9c8;
  BrotliOnePassArena *begin;
  size_t *storage_ix_00;
  BrotliOnePassArena *s_00;
  undefined4 in_stack_ffffffffffffe9e8;
  int iVar23;
  BrotliOnePassArena *s_01;
  uint8_t *depths;
  size_t input_size_00;
  uint8_t *in_stack_ffffffffffffea08;
  uint in_stack_ffffffffffffea10;
  uint in_stack_ffffffffffffea14;
  uint in_stack_ffffffffffffea30;
  uint in_stack_ffffffffffffea34;
  uint8_t *local_1598;
  uint8_t *local_1590;
  uint local_1588;
  uint local_1584;
  ulong local_1570;
  int local_155c;
  uint8_t *local_1558;
  ulong local_1550;
  size_t local_1548;
  BrotliOnePassArena *local_1540;
  BrotliOnePassArena *local_1538;
  uint8_t *local_1530;
  uint8_t *local_1510;
  BrotliOnePassArena *local_14b0;
  uint8_t *local_14a8;
  uint8_t *local_1288;
  uint8_t *local_1280;
  uint8_t *local_1278;
  uint8_t *local_1270;
  uint8_t *local_1250;
  uint8_t *local_1248;
  uint8_t *local_1240;
  uint8_t *local_1238;
  ulong local_ae8;
  char *local_a68;
  char *local_9e8;
  
  lVar7 = in_RDI + 0x300;
  lVar8 = in_RDI + 0x380;
  lVar9 = in_RDI + 0x480;
  lVar10 = in_RDI + 0x100;
  local_1540 = in_RDX;
  if ((BrotliOnePassArena *)0x17fff < in_RDX) {
    local_1540 = (BrotliOnePassArena *)0x18000;
  }
  local_1548 = *in_R9 + 3;
  begin = local_1540;
  storage_ix_00 = in_R9;
  s_00 = in_R8;
  iVar23 = in_ECX;
  s_01 = in_RDX;
  depths = in_RSI;
  input_size_00 = in_RDI;
  BrotliStoreMetaBlockHeader((size_t)local_1540,0,in_R9,in_stack_00000008);
  *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
       0L << ((byte)*in_R9 & 7) | (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
  *in_R9 = *in_R9 + 0xd;
  local_1550 = BuildAndStoreLiteralPrefixCode
                         ((BrotliOnePassArena *)
                          CONCAT44(in_stack_ffffffffffffea14,in_stack_ffffffffffffea10),
                          in_stack_ffffffffffffea08,input_size_00,depths,(uint16_t *)s_01,
                          (size_t *)CONCAT44(iVar23,in_stack_ffffffffffffe9e8),
                          (uint8_t *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30));
  for (local_1570 = 0; local_1570 + 7 < *(ulong *)(in_RDI + 0x880); local_1570 = local_1570 + 8) {
    *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
         (ulong)*(byte *)(in_RDI + 0x680 + (local_1570 >> 3)) << ((byte)*in_R9 & 7) |
         (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
    *in_R9 = *in_R9 + 8;
  }
  uVar17 = *(ulong *)(in_RDI + 0x880);
  *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
       (ulong)*(byte *)(in_RDI + 0x680 + (*(ulong *)(in_RDI + 0x880) >> 3)) << ((byte)*in_R9 & 7) |
       (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
  *in_R9 = (uVar17 & 7) + *in_R9;
  local_1538 = local_1540;
  local_1530 = in_RSI;
  local_1510 = in_RSI;
  local_14b0 = in_RDX;
  local_14a8 = in_RSI;
  while( true ) {
    memcpy((void *)(in_RDI + 0x480),kCmdHistoSeed,0x200);
    local_155c = -1;
    puVar11 = local_14a8 + (long)local_1538;
    if ((BrotliOnePassArena *)0xf < local_1538) break;
LAB_007f7f56:
    local_14a8 = local_1538->lit_depth + (long)local_14a8;
    local_14b0 = (BrotliOnePassArena *)((long)local_14b0 - (long)local_1538);
    local_1538 = local_14b0;
    if ((BrotliOnePassArena *)0xffff < local_14b0) {
      local_1538 = (BrotliOnePassArena *)0x10000;
    }
    in_stack_ffffffffffffe9b8 = local_1538;
    if (((local_14b0 == (BrotliOnePassArena *)0x0) ||
        (&std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
          _S_max_size < (Elf64_Ehdr *)(local_1538->lit_depth + (long)local_1540->lit_depth))) ||
       (iVar4 = ShouldMergeBlock(s_01,(uint8_t *)CONCAT44(iVar23,in_stack_ffffffffffffe9e8),
                                 (size_t)s_00,(uint8_t *)storage_ix_00), iVar4 == 0)) {
      if (local_1510 < puVar11) {
        in_stack_ffffffffffffea08 = puVar11 + -(long)local_1510;
        if (in_stack_ffffffffffffea08 < (uint8_t *)0x1842) {
          if (in_stack_ffffffffffffea08 < (uint8_t *)0x6) {
            puVar11 = in_stack_ffffffffffffea08 + 0x28;
            bVar1 = puVar11[lVar7];
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (ulong)*(ushort *)(lVar8 + (long)puVar11 * 2) << ((byte)*in_R9 & 7) |
                 (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)bVar1 + *in_R9;
            *(int *)(lVar9 + (long)puVar11 * 4) = *(int *)(lVar9 + (long)puVar11 * 4) + 1;
          }
          else if (in_stack_ffffffffffffea08 < (uint8_t *)0x82) {
            pcVar19 = (char *)(in_stack_ffffffffffffea08 + -2);
            iVar4 = 0x1f;
            if ((uint)pcVar19 != 0) {
              for (; (uint)pcVar19 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            uVar5 = iVar4 - 1;
            uVar17 = (ulong)pcVar19 >> ((byte)uVar5 & 0x3f);
            lVar18 = uVar5 * 2 + uVar17 + 0x2a;
            bVar1 = *(byte *)(lVar7 + lVar18);
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
                 (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)bVar1 + *in_R9;
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (long)pcVar19 - (uVar17 << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
                 (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)uVar5 + *in_R9;
            *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
          }
          else if (in_stack_ffffffffffffea08 < (uint8_t *)0x842) {
            uVar5 = 0x1f;
            uVar6 = (uint)(in_stack_ffffffffffffea08 + -0x42);
            if (uVar6 != 0) {
              for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar17 = (ulong)(uVar5 + 0x32);
            bVar1 = *(byte *)(lVar7 + uVar17);
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (ulong)*(ushort *)(lVar8 + uVar17 * 2) << ((byte)*in_R9 & 7) |
                 (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)bVar1 + *in_R9;
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (long)(in_stack_ffffffffffffea08 + -0x42) - (1L << ((byte)uVar5 & 0x3f)) <<
                 ((byte)*in_R9 & 7) | (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)uVar5 + *in_R9;
            *(int *)(lVar9 + uVar17 * 4) = *(int *)(lVar9 + uVar17 * 4) + 1;
          }
          else {
            bVar1 = *(byte *)(in_RDI + 0x33d);
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (ulong)*(ushort *)(in_RDI + 0x3fa) << ((byte)*in_R9 & 7) |
                 (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)bVar1 + *in_R9;
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (long)(in_stack_ffffffffffffea08 + -0x842) << ((byte)*in_R9 & 7) |
                 (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = *in_R9 + 0xc;
            *(int *)(in_RDI + 0x574) = *(int *)(in_RDI + 0x574) + 1;
          }
          for (local_a68 = (char *)0x0; local_a68 < in_stack_ffffffffffffea08;
              local_a68 = local_a68 + 1) {
            bVar1 = *(byte *)(in_RDI + local_1510[(long)local_a68]);
            *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                 (ulong)*(ushort *)(lVar10 + (ulong)local_1510[(long)local_a68] * 2) <<
                 ((byte)*in_R9 & 7) | (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
            *in_R9 = (ulong)bVar1 + *in_R9;
          }
        }
        else {
          pcVar19 = (char *)(((long)local_1510 - (long)local_1530) * 0x32);
          if ((pcVar19 < in_stack_ffffffffffffea08 ||
              (long)pcVar19 - (long)in_stack_ffffffffffffea08 == 0) && 0x3d4 < local_1550) {
            EmitUncompressedMetaBlock
                      (begin->lit_depth,(uint8_t *)in_stack_ffffffffffffe9c8,
                       CONCAT17(in_stack_ffffffffffffe9c7,
                                CONCAT16(in_stack_ffffffffffffe9c6,
                                         CONCAT15(in_stack_ffffffffffffe9c5,
                                                  CONCAT14(in_stack_ffffffffffffe9c4,
                                                           in_stack_ffffffffffffe9c0)))),
                       (size_t *)in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0->lit_depth);
          }
          else {
            if (in_stack_ffffffffffffea08 < (uint8_t *)0x5842) {
              bVar1 = *(byte *)(in_RDI + 0x33e);
              *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                   (ulong)*(ushort *)(in_RDI + 0x3fc) << ((byte)*in_R9 & 7) |
                   (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
              *in_R9 = (ulong)bVar1 + *in_R9;
              *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                   (long)(in_stack_ffffffffffffea08 + -0x1842) << ((byte)*in_R9 & 7) |
                   (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
              *in_R9 = *in_R9 + 0xe;
              *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + 1;
            }
            else {
              bVar1 = *(byte *)(in_RDI + 0x33f);
              *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                   (ulong)*(ushort *)(in_RDI + 0x3fe) << ((byte)*in_R9 & 7) |
                   (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
              *in_R9 = (ulong)bVar1 + *in_R9;
              *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                   (long)(in_stack_ffffffffffffea08 + -0x5842) << ((byte)*in_R9 & 7) |
                   (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
              *in_R9 = *in_R9 + 0x18;
              *(int *)(in_RDI + 0x57c) = *(int *)(in_RDI + 0x57c) + 1;
            }
            for (local_9e8 = (char *)0x0; local_9e8 < in_stack_ffffffffffffea08;
                local_9e8 = local_9e8 + 1) {
              bVar1 = *(byte *)(in_RDI + local_1510[(long)local_9e8]);
              *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
                   (ulong)*(ushort *)(lVar10 + (ulong)local_1510[(long)local_9e8] * 2) <<
                   ((byte)*in_R9 & 7) | (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
              *in_R9 = (ulong)bVar1 + *in_R9;
            }
          }
        }
      }
LAB_007f923f:
      if (local_14b0 == (BrotliOnePassArena *)0x0) {
        if (in_ECX == 0) {
          *(undefined1 *)(in_RDI + 0x680) = 0;
          *(undefined8 *)(in_RDI + 0x880) = 0;
          BuildAndStoreCommandPrefixCode(s_00,storage_ix_00,begin->lit_depth);
        }
        return;
      }
      local_1530 = local_14a8;
      local_1540 = local_14b0;
      if ((BrotliOnePassArena *)0x17fff < local_14b0) {
        local_1540 = (BrotliOnePassArena *)0x18000;
      }
      local_1548 = *in_R9 + 3;
      in_stack_ffffffffffffe9b0 = local_1540;
      BrotliStoreMetaBlockHeader((size_t)local_1540,0,in_R9,in_stack_00000008);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           0L << ((byte)*in_R9 & 7) | (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = *in_R9 + 0xd;
      local_1550 = BuildAndStoreLiteralPrefixCode
                             ((BrotliOnePassArena *)
                              CONCAT44(in_stack_ffffffffffffea14,in_stack_ffffffffffffea10),
                              in_stack_ffffffffffffea08,input_size_00,depths,(uint16_t *)s_01,
                              (size_t *)CONCAT44(iVar23,in_stack_ffffffffffffe9e8),
                              (uint8_t *)
                              CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30));
      BuildAndStoreCommandPrefixCode(s_00,storage_ix_00,begin->lit_depth);
      local_1538 = local_1540;
      local_1510 = local_14a8;
    }
    else {
      local_1540 = (BrotliOnePassArena *)(local_1540->lit_depth + (long)local_1538->lit_depth);
      UpdateBits(0x14,(int)local_1540 - 1,local_1548,in_stack_00000008);
    }
  }
  puVar21 = (uint16_t *)((long)local_1538[-1].tmp_bits + 0x7b);
  in_stack_ffffffffffffe9c8 = local_14b0[-1].tmp_bits + 0x38;
  if (puVar21 < in_stack_ffffffffffffe9c8) {
    in_stack_ffffffffffffe9c8 = puVar21;
  }
  puVar12 = local_14a8 + (long)in_stack_ffffffffffffe9c8;
  local_1558 = local_14a8 + 1;
  local_1584 = (uint)((ulong)(*(long *)local_1558 * 0x1e35a7bd000000) >> 0x20);
  do {
    local_1584 = local_1584 >> 0x17;
    local_1588 = 0x20;
    local_1590 = local_1558;
    puVar13 = local_1590;
LAB_007f423a:
    do {
      local_1590 = puVar13;
      uVar5 = local_1588 + 1;
      puVar13 = local_1590 + (local_1588 >> 5);
      if (puVar12 < puVar13) goto LAB_007f7f56;
      uVar6 = (uint)((ulong)(*(long *)puVar13 * 0x1e35a7bd000000) >> 0x37);
      local_1598 = local_1590 + -(long)local_155c;
      in_stack_ffffffffffffe9c7 = false;
      if (*(int *)local_1590 == *(int *)local_1598) {
        in_stack_ffffffffffffe9c7 = local_1590[4] == local_1598[4];
      }
      iVar4 = (int)local_1590;
      iVar3 = (int)in_RSI;
      local_1588 = uVar5;
      if (((bool)in_stack_ffffffffffffe9c7 == false) || (local_1590 <= local_1598)) {
        local_1598 = in_RSI + *(int *)(in_R8->lit_depth + (ulong)local_1584 * 4);
        *(int *)(in_R8->lit_depth + (ulong)local_1584 * 4) = iVar4 - iVar3;
        in_stack_ffffffffffffe9c6 = false;
        if (*(int *)local_1590 == *(int *)local_1598) {
          in_stack_ffffffffffffe9c6 = local_1590[4] == local_1598[4];
        }
        local_1584 = uVar6;
        if ((bool)in_stack_ffffffffffffe9c6 == false) goto LAB_007f423a;
      }
      else {
        *(int *)(in_R8->lit_depth + (ulong)local_1584 * 4) = iVar4 - iVar3;
      }
      local_1584 = uVar6;
    } while (0x3fff0 < (long)local_1590 - (long)local_1598);
    puVar13 = local_1598 + 5;
    local_1248 = local_1590 + 5;
    local_1250 = puVar11 + (-5 - (long)local_1590);
    local_1240 = puVar13;
LAB_007f45c2:
    if (local_1250 < (uint8_t *)0x8) {
      while( true ) {
        bVar22 = false;
        if (local_1250 != (uint8_t *)0x0) {
          bVar22 = *local_1240 == *local_1248;
        }
        if (!bVar22) break;
        local_1250 = local_1250 + -1;
        local_1248 = local_1248 + 1;
        local_1240 = local_1240 + 1;
      }
      local_1238 = local_1240 + -(long)puVar13;
      in_stack_ffffffffffffe9c5 = 0;
    }
    else {
      uVar17 = *(ulong *)local_1248 ^ *(ulong *)local_1240;
      local_1248 = local_1248 + 8;
      if (uVar17 == 0) break;
      iVar2 = 0;
      for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        iVar2 = iVar2 + 1;
      }
      local_1238 = local_1240 + (((ulong)(long)iVar2 >> 3) - (long)puVar13);
    }
    puVar13 = local_1238 + 5;
    iVar4 = iVar4 - (int)local_1598;
    uVar17 = (long)local_1590 - (long)local_1510;
    puVar14 = puVar13 + (long)local_1590;
    if (uVar17 < 0x1842) {
      if (uVar17 < 6) {
        lVar18 = uVar17 + 0x28;
        bVar1 = *(byte *)(lVar7 + lVar18);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
      }
      else if (uVar17 < 0x82) {
        uVar15 = uVar17 - 2;
        iVar2 = 0x1f;
        if ((uint)uVar15 != 0) {
          for (; (uint)uVar15 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = iVar2 - 1;
        uVar16 = uVar15 >> ((byte)uVar5 & 0x3f);
        lVar18 = uVar5 * 2 + uVar16 + 0x2a;
        bVar1 = *(byte *)(lVar7 + lVar18);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             uVar15 - (uVar16 << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)uVar5 + *in_R9;
        *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
      }
      else if (uVar17 < 0x842) {
        uVar5 = 0x1f;
        uVar6 = (uint)(uVar17 - 0x42);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar15 = (ulong)(uVar5 + 0x32);
        bVar1 = *(byte *)(lVar7 + uVar15);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(lVar8 + uVar15 * 2) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (uVar17 - 0x42) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)uVar5 + *in_R9;
        *(int *)(lVar9 + uVar15 * 4) = *(int *)(lVar9 + uVar15 * 4) + 1;
      }
      else {
        bVar1 = *(byte *)(in_RDI + 0x33d);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(in_RDI + 0x3fa) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             uVar17 - 0x842 << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = *in_R9 + 0xc;
        *(int *)(in_RDI + 0x574) = *(int *)(in_RDI + 0x574) + 1;
      }
    }
    else {
      uVar15 = ((long)local_1510 - (long)local_1530) * 0x32;
      if ((uVar15 < uVar17 || uVar15 - uVar17 == 0) && 0x3d4 < local_1550) {
        EmitUncompressedMetaBlock
                  (begin->lit_depth,(uint8_t *)in_stack_ffffffffffffe9c8,
                   CONCAT17(in_stack_ffffffffffffe9c7,
                            CONCAT16(in_stack_ffffffffffffe9c6,
                                     CONCAT15(in_stack_ffffffffffffe9c5,
                                              CONCAT14(in_stack_ffffffffffffe9c4,
                                                       in_stack_ffffffffffffe9c0)))),
                   (size_t *)in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0->lit_depth);
        local_14b0 = (BrotliOnePassArena *)
                     ((long)local_14b0 - ((long)local_1590 - (long)local_14a8));
        local_14a8 = local_1590;
        goto LAB_007f923f;
      }
      if (uVar17 < 0x5842) {
        bVar1 = *(byte *)(in_RDI + 0x33e);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(in_RDI + 0x3fc) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             uVar17 - 0x1842 << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = *in_R9 + 0xe;
        *(int *)(in_RDI + 0x578) = *(int *)(in_RDI + 0x578) + 1;
      }
      else {
        bVar1 = *(byte *)(in_RDI + 0x33f);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(in_RDI + 0x3fe) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             uVar17 - 0x5842 << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = *in_R9 + 0x18;
        *(int *)(in_RDI + 0x57c) = *(int *)(in_RDI + 0x57c) + 1;
      }
    }
    for (local_ae8 = 0; local_ae8 < uVar17; local_ae8 = local_ae8 + 1) {
      bVar1 = *(byte *)(in_RDI + local_1510[local_ae8]);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar10 + (ulong)local_1510[local_ae8] * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
    }
    if (iVar4 == local_155c) {
      bVar1 = *(byte *)(in_RDI + 0x340);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(in_RDI + 0x400) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(int *)(in_RDI + 0x580) = *(int *)(in_RDI + 0x580) + 1;
    }
    else {
      uVar17 = (long)iVar4 + 3;
      iVar2 = 0x1f;
      if ((uint)uVar17 != 0) {
        for (; (uint)uVar17 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar20 = (byte)(iVar2 - 1U);
      uVar15 = uVar17 >> (bVar20 & 0x3f) & 1;
      lVar18 = (uint)((iVar2 + -2) * 2) + uVar15 + 0x50;
      bVar1 = *(byte *)(lVar7 + lVar18);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           uVar17 - (uVar15 + 2 << (bVar20 & 0x3f)) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)(iVar2 - 1U) + *in_R9;
      *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
      local_155c = iVar4;
    }
    if (puVar13 < (uint8_t *)0xc) {
      bVar1 = local_1238[in_RDI + 0x301];
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar8 + (long)(local_1238 + 1) * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(int *)(lVar9 + (long)(local_1238 + 1) * 4) =
           *(int *)(lVar9 + (long)(local_1238 + 1) * 4) + 1;
    }
    else if (puVar13 < (uint8_t *)0x48) {
      local_1238 = local_1238 + -3;
      iVar4 = 0x1f;
      if ((uint)local_1238 != 0) {
        for (; (uint)local_1238 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar5 = iVar4 - 1;
      uVar17 = (ulong)local_1238 >> ((byte)uVar5 & 0x3f);
      lVar18 = uVar5 * 2 + uVar17 + 4;
      bVar1 = *(byte *)(lVar7 + lVar18);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (long)local_1238 - (uVar17 << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)uVar5 + *in_R9;
      *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
    }
    else if (puVar13 < (uint8_t *)0x88) {
      lVar18 = ((ulong)(local_1238 + -3) >> 5) + 0x1e;
      bVar1 = *(byte *)(lVar7 + lVar18);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           ((ulong)(local_1238 + -3) & 0x1f) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = *in_R9 + 5;
      bVar1 = *(byte *)(in_RDI + 0x340);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(in_RDI + 0x400) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
      *(int *)(in_RDI + 0x580) = *(int *)(in_RDI + 0x580) + 1;
    }
    else if (puVar13 < (uint8_t *)0x848) {
      uVar5 = 0x1f;
      uVar6 = (uint)(local_1238 + -0x43);
      if (uVar6 != 0) {
        for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar17 = (ulong)(uVar5 + 0x1c);
      bVar1 = *(byte *)(lVar7 + uVar17);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar8 + uVar17 * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (long)(local_1238 + -0x43) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)uVar5 + *in_R9;
      bVar1 = *(byte *)(in_RDI + 0x340);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(in_RDI + 0x400) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(int *)(lVar9 + uVar17 * 4) = *(int *)(lVar9 + uVar17 * 4) + 1;
      *(int *)(in_RDI + 0x580) = *(int *)(in_RDI + 0x580) + 1;
    }
    else {
      bVar1 = *(byte *)(in_RDI + 0x327);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(in_RDI + 0x3ce) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (long)(local_1238 + -0x843) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = *in_R9 + 0x18;
      bVar1 = *(byte *)(in_RDI + 0x340);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(in_RDI + 0x400) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(int *)(in_RDI + 0x51c) = *(int *)(in_RDI + 0x51c) + 1;
      *(int *)(in_RDI + 0x580) = *(int *)(in_RDI + 0x580) + 1;
    }
    local_1510 = puVar14;
    if (puVar12 <= puVar14) goto LAB_007f7f56;
    uVar17 = *(ulong *)(puVar14 + -3);
    uVar15 = (uVar17 >> 0x18) * 0x1e35a7bd000000;
    uVar16 = uVar15 >> 0x37;
    in_stack_ffffffffffffea30 = (uint)(uVar15 >> 0x37);
    iVar2 = (int)puVar14;
    *(int *)(in_R8->lit_depth + (uVar17 * 0x1e35a7bd000000 >> 0x37) * 4) = (iVar2 - iVar3) + -3;
    *(int *)(in_R8->lit_depth + ((uVar17 >> 8) * 0x1e35a7bd000000 >> 0x37) * 4) =
         (iVar2 - iVar3) + -2;
    uVar17 = (uVar17 >> 0x10) * 0x1e35a7bd000000;
    in_stack_ffffffffffffea34 = (uint)(uVar17 >> 0x37);
    *(int *)(in_R8->lit_depth + (uVar17 >> 0x37) * 4) = (iVar2 - iVar3) + -1;
    iVar4 = *(int *)(in_R8->lit_depth + uVar16 * 4);
    *(int *)(in_R8->lit_depth + uVar16 * 4) = iVar2 - iVar3;
    while( true ) {
      local_1598 = in_RSI + iVar4;
      in_stack_ffffffffffffe9c4 = false;
      if (*(int *)local_1510 == *(int *)local_1598) {
        in_stack_ffffffffffffe9c4 = local_1510[4] == local_1598[4];
      }
      if ((bool)in_stack_ffffffffffffe9c4 == false) break;
      puVar13 = local_1598 + 5;
      local_1280 = local_1510 + 5;
      local_1288 = puVar11 + (-5 - (long)local_1510);
      local_1278 = puVar13;
LAB_007f6e52:
      uVar5 = in_stack_ffffffffffffe9c0;
      if (local_1288 < (uint8_t *)0x8) {
        while( true ) {
          in_stack_ffffffffffffe9c0 = uVar5 & 0xffffff;
          if (local_1288 != (uint8_t *)0x0) {
            in_stack_ffffffffffffe9c0 = CONCAT13(*local_1278 == *local_1280,(int3)uVar5);
          }
          if ((char)(in_stack_ffffffffffffe9c0 >> 0x18) == '\0') break;
          local_1288 = local_1288 + -1;
          local_1280 = local_1280 + 1;
          local_1278 = local_1278 + 1;
          uVar5 = in_stack_ffffffffffffe9c0;
        }
        local_1270 = local_1278 + -(long)puVar13;
      }
      else {
        uVar17 = *(ulong *)local_1280 ^ *(ulong *)local_1278;
        local_1280 = local_1280 + 8;
        if (uVar17 == 0) goto LAB_007f6f24;
        iVar4 = 0;
        for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          iVar4 = iVar4 + 1;
        }
        local_1270 = local_1278 + (((ulong)(long)iVar4 >> 3) - (long)puVar13);
      }
      puVar13 = local_1270 + 5;
      if (0x3fff0 < (long)local_1510 - (long)local_1598) break;
      puVar14 = puVar13 + (long)local_1510;
      local_155c = (int)local_1510 - (int)local_1598;
      if (puVar13 < (uint8_t *)0xa) {
        bVar1 = puVar13[in_RDI + 0x30e];
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(in_RDI + 0x39c + (long)puVar13 * 2) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(int *)(in_RDI + 0x4b8 + (long)puVar13 * 4) =
             *(int *)(in_RDI + 0x4b8 + (long)puVar13 * 4) + 1;
      }
      else if (puVar13 < (uint8_t *)0x86) {
        local_1270 = local_1270 + -1;
        iVar4 = 0x1f;
        if ((uint)local_1270 != 0) {
          for (; (uint)local_1270 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar5 = iVar4 - 1;
        uVar17 = (ulong)local_1270 >> ((byte)uVar5 & 0x3f);
        lVar18 = uVar5 * 2 + uVar17 + 0x14;
        bVar1 = *(byte *)(lVar7 + lVar18);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (long)local_1270 - (uVar17 << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)uVar5 + *in_R9;
        *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
      }
      else if (puVar13 < (uint8_t *)0x846) {
        uVar5 = 0x1f;
        uVar6 = (uint)(local_1270 + -0x41);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar17 = (ulong)(uVar5 + 0x1c);
        bVar1 = *(byte *)(lVar7 + uVar17);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(lVar8 + uVar17 * 2) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (long)(local_1270 + -0x41) - (1L << ((byte)uVar5 & 0x3f)) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)uVar5 + *in_R9;
        *(int *)(lVar9 + uVar17 * 4) = *(int *)(lVar9 + uVar17 * 4) + 1;
      }
      else {
        bVar1 = *(byte *)(in_RDI + 0x327);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)(in_RDI + 0x3ce) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (long)(local_1270 + -0x841) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = *in_R9 + 0x18;
        *(int *)(in_RDI + 0x51c) = *(int *)(in_RDI + 0x51c) + 1;
      }
      uVar17 = (long)local_155c + 3;
      iVar4 = 0x1f;
      if ((uint)uVar17 != 0) {
        for (; (uint)uVar17 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      bVar20 = (byte)(iVar4 - 1U);
      uVar15 = uVar17 >> (bVar20 & 0x3f) & 1;
      lVar18 = (uint)((iVar4 + -2) * 2) + uVar15 + 0x50;
      bVar1 = *(byte *)(lVar7 + lVar18);
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           (ulong)*(ushort *)(lVar8 + lVar18 * 2) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)bVar1 + *in_R9;
      *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
           uVar17 - (uVar15 + 2 << (bVar20 & 0x3f)) << ((byte)*in_R9 & 7) |
           (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
      *in_R9 = (ulong)(iVar4 - 1U) + *in_R9;
      *(int *)(lVar9 + lVar18 * 4) = *(int *)(lVar9 + lVar18 * 4) + 1;
      local_1510 = puVar14;
      if (puVar12 <= puVar14) goto LAB_007f7f56;
      uVar17 = *(ulong *)(puVar14 + -3);
      uVar15 = (uVar17 >> 0x18) * 0x1e35a7bd000000;
      uVar16 = uVar15 >> 0x37;
      in_stack_ffffffffffffea10 = (uint)(uVar15 >> 0x37);
      iVar2 = (int)puVar14;
      *(int *)(in_R8->lit_depth + (uVar17 * 0x1e35a7bd000000 >> 0x37) * 4) = (iVar2 - iVar3) + -3;
      *(int *)(in_R8->lit_depth + ((uVar17 >> 8) * 0x1e35a7bd000000 >> 0x37) * 4) =
           (iVar2 - iVar3) + -2;
      uVar17 = (uVar17 >> 0x10) * 0x1e35a7bd000000;
      in_stack_ffffffffffffea14 = (uint)(uVar17 >> 0x37);
      *(int *)(in_R8->lit_depth + (uVar17 >> 0x37) * 4) = (iVar2 - iVar3) + -1;
      iVar4 = *(int *)(in_R8->lit_depth + uVar16 * 4);
      *(int *)(in_R8->lit_depth + uVar16 * 4) = iVar2 - iVar3;
    }
    local_1558 = local_1510 + 1;
    local_1584 = (uint)((ulong)(*(long *)local_1558 * 0x1e35a7bd000000) >> 0x20);
  } while( true );
  local_1240 = local_1240 + 8;
  local_1250 = local_1250 + -8;
  goto LAB_007f45c2;
LAB_007f6f24:
  local_1278 = local_1278 + 8;
  local_1288 = local_1288 + -8;
  goto LAB_007f6e52;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentFast(
    BrotliOnePassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          s, input, input_size, is_last, table, storage_ix, storage);\
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}